

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_tests.cpp
# Opt level: O2

void __thiscall
wallet::init_tests::walletinit_verify_walletdir_no_trailing2::test_method
          (walletinit_verify_walletdir_no_trailing2 *this)

{
  long lVar1;
  string arg;
  int iVar2;
  mapped_type *walletdir_path;
  iterator in_R8;
  iterator pvVar3;
  iterator in_R9;
  iterator pvVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string file;
  const_string file_00;
  undefined4 uVar5;
  undefined4 uVar6;
  check_type cVar7;
  undefined8 in_stack_fffffffffffffe98;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  *this_00;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  allocator<char> local_121;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  undefined1 local_f0 [32];
  path local_d0;
  path expected_path;
  undefined1 local_80 [32];
  path walletdir;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&walletdir,"trailing2",(allocator<char> *)&expected_path);
  this_00 = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_walletdir_path_cases;
  walletdir_path =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
       ::operator[](this_00,(key_type *)&walletdir);
  InitWalletDirTestingSetup::SetWalletDir(&this->super_BOOST_AUTO_TEST_CASE_FIXTURE,walletdir_path);
  std::__cxx11::string::~string((string *)&walletdir);
  iVar2 = (*(((this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_wallet_loader._M_t.
              super___uniq_ptr_impl<interfaces::WalletLoader,_std::default_delete<interfaces::WalletLoader>_>
              ._M_t.
              super__Tuple_impl<0UL,_interfaces::WalletLoader_*,_std::default_delete<interfaces::WalletLoader>_>
              .super__Head_base<0UL,_interfaces::WalletLoader_*,_false>._M_head_impl)->
            super_ChainClient)._vptr_ChainClient[3])();
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = &DAT_00000050;
  file.m_begin = (iterator)&local_100;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_110,msg);
  expected_path.super_path._M_pathname._M_dataplus._M_p._0_1_ = (char)iVar2;
  expected_path.super_path._M_pathname._M_string_length = 0;
  expected_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  walletdir.super_path._M_pathname.field_2._8_8_ = local_f0;
  local_f0._0_8_ = "result == true";
  local_f0._8_8_ = "";
  walletdir.super_path._M_pathname._M_string_length._0_1_ = 0;
  walletdir.super_path._M_pathname._M_dataplus._M_p = "<W\x1b";
  walletdir.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_118 = "";
  uVar5 = 0;
  uVar6 = 0;
  pvVar3 = &DAT_00000001;
  pvVar4 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&expected_path,(lazy_ostream *)&walletdir,1,0,WARN,_cVar7,
             (size_t)&local_120,0x50);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&expected_path.super_path._M_pathname.field_2._M_allocated_capacity);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"-walletdir",(allocator<char> *)local_f0);
  expected_path.super_path._M_pathname.field_2._M_allocated_capacity = 0;
  expected_path.super_path._M_pathname.field_2._8_8_ = 0;
  expected_path.super_path._M_pathname._M_dataplus._M_p = (pointer)0x0;
  expected_path.super_path._M_pathname._M_string_length = 0;
  expected_path.super_path._M_cmpts._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x0;
  std::filesystem::__cxx11::path::path(&expected_path.super_path);
  arg._M_dataplus._M_p._4_4_ = uVar6;
  arg._M_dataplus._M_p._0_4_ = uVar5;
  arg._M_string_length = (size_type)_cVar7;
  arg.field_2._M_allocated_capacity = in_stack_fffffffffffffe98;
  arg.field_2._8_8_ = this_00;
  ArgsManager::GetPathArg
            (&walletdir,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_BasicTestingSetup.m_args,
             arg,(path *)local_80);
  std::filesystem::__cxx11::path::~path(&expected_path.super_path);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_f0,"default",&local_121);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_fs::path>_>_>
  ::operator[](this_00,(key_type *)local_f0);
  std::filesystem::canonical(&local_d0);
  std::filesystem::__cxx11::path::path(&expected_path.super_path,(path *)&local_d0);
  std::filesystem::__cxx11::path::~path((path *)&local_d0);
  std::__cxx11::string::~string((string *)local_f0);
  local_138 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar4;
  msg_00.m_begin = pvVar3;
  file_00.m_end = (iterator)0x53;
  file_00.m_begin = (iterator)&local_138;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_148,
             msg_00);
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_01139f30;
  local_f0._16_8_ = boost::unit_test::lazy_ostream::inst;
  local_f0._24_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/init_tests.cpp"
  ;
  local_150 = "";
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,fs::path,fs::path>
            (local_f0,&local_158,0x53,1,2,&walletdir,0xc76fc8,&expected_path.super_path,
             "expected_path");
  std::filesystem::__cxx11::path::~path(&expected_path.super_path);
  std::filesystem::__cxx11::path::~path(&walletdir.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(walletinit_verify_walletdir_no_trailing2)
{
    SetWalletDir(m_walletdir_path_cases["trailing2"]);
    bool result = m_wallet_loader->verify();
    BOOST_CHECK(result == true);
    fs::path walletdir = m_args.GetPathArg("-walletdir");
    fs::path expected_path = fs::canonical(m_walletdir_path_cases["default"]);
    BOOST_CHECK_EQUAL(walletdir, expected_path);
}